

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetBooleanVerifier::verifyFloatRange
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLfloat min,GLfloat max)

{
  bool bVar1;
  qpTestResult qVar2;
  uchar (*pauVar3) [2];
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  char *local_460;
  char *local_438;
  char *local_3e0;
  char *local_3b8;
  char *local_360;
  char *local_358;
  MessageBuilder local_350;
  char *local_1d0;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  StateQueryMemoryWriteGuard<unsigned_char[2]> local_2a;
  GLfloat GStack_24;
  StateQueryMemoryWriteGuard<unsigned_char[2]> range;
  GLfloat max_local;
  GLfloat min_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetBooleanVerifier *this_local;
  
  GStack_24 = max;
  range._2_4_ = min;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[2]>::
  StateQueryMemoryWriteGuard(&local_2a);
  pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)&local_2a);
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*pauVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[2]>::verifyValidity
                    (&local_2a,testCtx);
  if (bVar1) {
    pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&local_2a);
    if (((*pauVar3)[0] != '\0') || ((0.0 <= GStack_24 && (0.0 <= (float)range._2_4_)))) {
      pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&local_2a);
      if (((*pauVar3)[1] == '\0') && ((0.0 < GStack_24 || (0.0 < (float)range._2_4_)))) {
        pTVar4 = tcu::TestContext::getLog(testCtx);
        tcu::TestLog::operator<<(&local_350,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_350,(char (*) [18])"// ERROR: range [");
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(float *)((StateQueryMemoryWriteGuard<unsigned_char[2]> *)
                                            ((long)register0x00000020 + -0x22))->m_value);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stack0xffffffffffffffdc);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [20])"] is not in range [");
        pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&local_2a);
        if ((*pauVar3)[0] == '\x01') {
          local_438 = "GL_TRUE";
        }
        else {
          pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&local_2a);
          local_438 = "non-boolean";
          if ((*pauVar3)[0] == '\0') {
            local_438 = "GL_FALSE";
          }
        }
        local_358 = local_438;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_358);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
        pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&local_2a);
        if ((*pauVar3)[1] == '\x01') {
          local_460 = "GL_TRUE";
        }
        else {
          pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&local_2a);
          local_460 = "non-boolean";
          if ((*pauVar3)[1] == '\0') {
            local_460 = "GL_FALSE";
          }
        }
        local_360 = local_460;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_360);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29ea7ce);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_350);
        qVar2 = tcu::TestContext::getTestResult(testCtx);
        if (qVar2 == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean range");
        }
      }
    }
    else {
      pTVar4 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1b0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [18])"// ERROR: range [");
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(float *)((StateQueryMemoryWriteGuard<unsigned_char[2]> *)
                                          ((long)register0x00000020 + -0x22))->m_value);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stack0xffffffffffffffdc);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [20])"] is not in range [");
      pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&local_2a);
      if ((*pauVar3)[0] == '\x01') {
        local_3b8 = "GL_TRUE";
      }
      else {
        pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&local_2a);
        local_3b8 = "non-boolean";
        if ((*pauVar3)[0] == '\0') {
          local_3b8 = "GL_FALSE";
        }
      }
      local_1c8[0] = local_3b8;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1c8);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
      pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&local_2a);
      if ((*pauVar3)[1] == '\x01') {
        local_3e0 = "GL_TRUE";
      }
      else {
        pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&local_2a);
        local_3e0 = "non-boolean";
        if ((*pauVar3)[1] == '\0') {
          local_3e0 = "GL_FALSE";
        }
      }
      local_1d0 = local_3e0;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1d0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29ea7ce);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean range");
      }
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyFloatRange (tcu::TestContext& testCtx, GLenum name, GLfloat min, GLfloat max)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[2]> range;
	glGetBooleanv(name, range);

	if (!range.verifyValidity(testCtx))
		return;

	if (range[0] == GL_FALSE)
	{
		if (max < 0 || min < 0)
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: range [" << min << ", " << max << "] is not in range [" << (range[0] == GL_TRUE ? "GL_TRUE" : (range[0] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << ", " << (range[1] == GL_TRUE ? "GL_TRUE" : (range[1] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << "]"  << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean range");
			return;
		}
	}
	if (range[1] == GL_FALSE)
	{
		if (max > 0 || min > 0)
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: range [" << min << ", " << max << "] is not in range [" << (range[0] == GL_TRUE ? "GL_TRUE" : (range[0] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << ", " << (range[1] == GL_TRUE ? "GL_TRUE" : (range[1] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << "]"  << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean range");
			return;
		}
	}
}